

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

PolynomialType * __thiscall
OpenMD::Polynomial<double>::operator+=(Polynomial<double> *this,PolynomialType *p)

{
  bool bVar1;
  const_iterator coefficient;
  pointer ppVar2;
  Polynomial<double> *in_RSI;
  PolynomialType *in_RDI;
  const_iterator i;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  _Self local_28;
  const_iterator cVar3;
  
  std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)&stack0xffffffffffffffe8);
  coefficient = begin((Polynomial<double> *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  cVar3 = coefficient;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         end((Polynomial<double> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,&local_28);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x3876c9);
    in_stack_ffffffffffffffcc = ppVar2->first;
    std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x3876d9);
    addCoefficient(in_RSI,(int)((ulong)cVar3._M_node >> 0x20),(double *)coefficient._M_node);
    std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)in_RDI);
  }
  return in_RDI;
}

Assistant:

PolynomialType& operator+=(const PolynomialType& p) {
      typename Polynomial<Real>::const_iterator i;

      for (i = p.begin(); i != p.end(); ++i) {
        this->addCoefficient(i->first, i->second);
      }

      return *this;
    }